

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_stdlib.c
# Opt level: O0

int p2sc_spawn(char *cmd,char **sout,char **serr)

{
  int iVar1;
  long *in_RDX;
  long *in_RSI;
  undefined8 in_RDI;
  GError *err;
  int stat;
  undefined8 in_stack_ffffffffffffff90;
  undefined4 uVar2;
  char *local_58;
  char *local_48;
  long local_30;
  int local_24;
  long *local_20;
  long *local_18;
  undefined8 local_10;
  
  uVar2 = (undefined4)((ulong)in_stack_ffffffffffffff90 >> 0x20);
  local_30 = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar1 = g_spawn_command_line_sync(in_RDI,in_RSI,in_RDX,&local_24,&local_30);
  if (iVar1 != 0) {
    if (local_24 != 0) {
      if ((*local_18 == 0) || (*(char *)*local_18 == '\0')) {
        local_48 = "(null)";
      }
      else {
        local_48 = (char *)*local_18;
      }
      if ((*local_20 == 0) || (*(char *)*local_20 == '\0')) {
        local_58 = "(null)";
      }
      else {
        local_58 = (char *)*local_20;
      }
      _p2sc_msg("p2sc_spawn",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_stdlib.c"
                ,0xae,"$Id: p2sc_stdlib.c 5108 2014-06-19 12:29:23Z bogdan $",3000,
                "%s failed with exit status:%d\nstdout: %s\nstderr: %s",local_10,
                CONCAT44(uVar2,local_24),local_48,local_58);
    }
    return local_24;
  }
  if ((local_30 != 0) && (*(long *)(local_30 + 8) != 0)) {
    _p2sc_msg("p2sc_spawn",
              "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_stdlib.c"
              ,0xa4,"$Id: p2sc_stdlib.c 5108 2014-06-19 12:29:23Z bogdan $",4000,"spawn(%s): %s",
              local_10,*(undefined8 *)(local_30 + 8));
    exit(1);
  }
  _p2sc_msg("p2sc_spawn",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_stdlib.c"
            ,0xa7,"$Id: p2sc_stdlib.c 5108 2014-06-19 12:29:23Z bogdan $",4000,
            "spawn(%s): unknown failure",local_10);
  exit(1);
}

Assistant:

int p2sc_spawn(const char *cmd, char **sout, char **serr) {
    int stat;
    GError *err = NULL;

    if (!g_spawn_command_line_sync(cmd, sout, serr, &stat, &err)) {
        if (err && err->message) {
            P2SC_Msg(LVL_FATAL, "spawn(%s): %s", cmd, err->message);
            g_error_free(err);
        } else
            P2SC_Msg(LVL_FATAL, "spawn(%s): unknown failure", cmd);
    }

    if (stat)
        P2SC_Msg(LVL_WARNING,
                 "%s failed with exit status:%d\nstdout: %s\nstderr: %s",
                 cmd, stat, (*sout && **sout) ? *sout : "(null)",
                 (*serr && **serr) ? *serr : "(null)");

    return stat;
}